

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O1

void __thiscall testing::internal::MatchMatrix::Randomize(MatchMatrix *this)

{
  pointer pcVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (this->num_elements_ != 0) {
    uVar4 = 0;
    do {
      uVar5 = this->num_matchers_;
      if (uVar5 != 0) {
        uVar3 = 0;
        do {
          pcVar1 = (this->matched_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar2 = rand();
          pcVar1[uVar3 + uVar5 * uVar4] = (byte)iVar2 & 1;
          uVar3 = uVar3 + 1;
          uVar5 = this->num_matchers_;
        } while (uVar3 < uVar5);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < this->num_elements_);
  }
  return;
}

Assistant:

void MatchMatrix::Randomize() {
  for (size_t ilhs = 0; ilhs < LhsSize(); ++ilhs) {
    for (size_t irhs = 0; irhs < RhsSize(); ++irhs) {
      char& b = matched_[SpaceIndex(ilhs, irhs)];
      b = static_cast<char>(rand() & 1);  // NOLINT
    }
  }
}